

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O2

QStringList * __thiscall
QAccessibleMenuItem::actionNames(QStringList *__return_storage_ptr__,QAccessibleMenuItem *this)

{
  char cVar1;
  QMenu *pQVar2;
  QString *args;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  if (this->m_action != (QAction *)0x0) {
    cVar1 = QAction::isSeparator();
    if (cVar1 == '\0') {
      pQVar2 = QAction::menu<QMenu*>(this->m_action);
      if (pQVar2 == (QMenu *)0x0) {
        args = (QString *)QAccessibleActionInterface::pressAction();
      }
      else {
        args = (QString *)QAccessibleActionInterface::showMenuAction();
      }
      QList<QString>::emplaceBack<QString_const&>(__return_storage_ptr__,args);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QAccessibleMenuItem::actionNames() const
{
    QStringList actions;
    if (!m_action || m_action->isSeparator())
        return actions;

    if (m_action->menu()) {
        actions << showMenuAction();
    } else {
        actions << pressAction();
    }
    return actions;
}